

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist_node.h
# Opt level: O2

void __thiscall
spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
          (IntrusiveNodeBase<spvtools::opt::Instruction> *this)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  
  if (this->is_sentinel_ == true) {
    __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                  ,0xca,
                  "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                 );
  }
  pIVar1 = this->next_node_;
  if (pIVar1 != (Instruction *)0x0) {
    pIVar2 = this->previous_node_;
    (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar2;
    (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
    this->next_node_ = (Instruction *)0x0;
    this->previous_node_ = (Instruction *)0x0;
    return;
  }
  __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                ,0xcc,
                "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
               );
}

Assistant:

inline void IntrusiveNodeBase<NodeType>::RemoveFromList() {
  assert(!this->is_sentinel_ && "Sentinel nodes cannot be moved around.");
  assert(this->IsInAList() &&
         "Cannot remove a node from a list if it is not in a list.");

  this->next_node_->previous_node_ = this->previous_node_;
  this->previous_node_->next_node_ = this->next_node_;
  this->next_node_ = nullptr;
  this->previous_node_ = nullptr;
}